

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptlinux.c
# Opt level: O2

PtTimestamp Pt_Time(void)

{
  timeb now;
  int local_18 [2];
  ushort local_10;
  
  ftime(local_18);
  return ((local_18[0] - (int)time_offset.time) * 1000 + (uint)local_10) - (uint)time_offset.millitm
  ;
}

Assistant:

PtTimestamp Pt_Time()
{
    long seconds, milliseconds;
    struct timeb now;
    ftime(&now);
    seconds = now.time - time_offset.time;
    milliseconds = now.millitm - time_offset.millitm;
    return seconds * 1000 + milliseconds;
}